

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::Sqrt::forward_impl
          (Sqrt *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  PointerType pfVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  ushort uVar6;
  Index index;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_ZMM2 [64];
  undefined1 in_XMM10 [16];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_68;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_48;
  
  auVar22 = in_ZMM1._0_16_;
  Tensor::operator*(&local_48,
                    *(xs->
                     super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                     _M_impl.super__Vector_impl_data._M_start);
  Tensor::operator*(&local_68,fx);
  if ((local_68.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value ==
       local_48.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value) &&
     (local_68.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value ==
      local_48.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value)) {
    uVar12 = local_48.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value *
             local_48.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
    uVar7 = uVar12;
    if ((((ulong)local_68.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar7 = (ulong)(-((uint)((ulong)local_68.
                                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                        .
                                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                        .m_data >> 2) & 0x3fffffff) & 0xf),
       (long)uVar12 <= (long)uVar7)) {
      uVar7 = uVar12;
    }
    uVar10 = uVar12 - uVar7;
    uVar8 = uVar10 + 0xf;
    if (-1 < (long)uVar10) {
      uVar8 = uVar10;
    }
    if (0 < (long)uVar7) {
      uVar11 = 0;
      do {
        auVar3 = vsqrtss_avx(auVar22,ZEXT416((uint)local_48.
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                  .m_data[uVar11]));
        local_68.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[uVar11] = auVar3._0_4_;
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
    }
    lVar9 = (uVar8 & 0xfffffffffffffff0) + uVar7;
    if (0xf < (long)uVar10) {
      auVar13 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
      auVar14 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
      auVar15 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
      auVar16 = vpbroadcastd_avx512f(ZEXT416(0x7fffff));
      auVar17 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
      do {
        auVar21 = *(undefined1 (*) [64])
                   (local_48.
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data + uVar7);
        auVar18 = vrsqrt14ps_avx512f(auVar21);
        auVar19 = vmulps_avx512f(auVar21,auVar13);
        auVar20 = vpaddd_avx512f(auVar21,auVar17);
        uVar5 = vptestnmd_avx512f(auVar21,auVar15);
        uVar4 = vpcmpud_avx512f(auVar20,auVar16,1);
        uVar6 = ~((ushort)uVar5 | (ushort)uVar4);
        auVar20 = vmulps_avx512f(auVar18,auVar18);
        auVar21 = vmulps_avx512f(auVar18,auVar21);
        auVar18 = vfmadd213ps_avx512f(auVar20,auVar19,auVar14);
        auVar21 = vmulps_avx512f(auVar21,auVar18);
        bVar2 = (byte)(uVar6 >> 8);
        pfVar1 = local_68.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data + uVar7;
        *pfVar1 = (float)((uint)((byte)uVar6 & 1) * auVar21._0_4_);
        pfVar1[1] = (float)((uint)((byte)(uVar6 >> 1) & 1) * auVar21._4_4_);
        pfVar1[2] = (float)((uint)((byte)(uVar6 >> 2) & 1) * auVar21._8_4_);
        pfVar1[3] = (float)((uint)((byte)(uVar6 >> 3) & 1) * auVar21._12_4_);
        pfVar1[4] = (float)((uint)((byte)(uVar6 >> 4) & 1) * auVar21._16_4_);
        pfVar1[5] = (float)((uint)((byte)(uVar6 >> 5) & 1) * auVar21._20_4_);
        pfVar1[6] = (float)((uint)((byte)(uVar6 >> 6) & 1) * auVar21._24_4_);
        pfVar1[7] = (float)((uint)((byte)(uVar6 >> 7) & 1) * auVar21._28_4_);
        pfVar1[8] = (float)((uint)(bVar2 & 1) * auVar21._32_4_);
        pfVar1[9] = (float)((uint)(bVar2 >> 1 & 1) * auVar21._36_4_);
        pfVar1[10] = (float)((uint)(bVar2 >> 2 & 1) * auVar21._40_4_);
        pfVar1[0xb] = (float)((uint)(bVar2 >> 3 & 1) * auVar21._44_4_);
        pfVar1[0xc] = (float)((uint)(bVar2 >> 4 & 1) * auVar21._48_4_);
        pfVar1[0xd] = (float)((uint)(bVar2 >> 5 & 1) * auVar21._52_4_);
        pfVar1[0xe] = (float)((uint)(bVar2 >> 6 & 1) * auVar21._56_4_);
        pfVar1[0xf] = (float)((uint)(bVar2 >> 7) * auVar21._60_4_);
        uVar7 = uVar7 + 0x10;
      } while ((long)uVar7 < lVar9);
    }
    if (lVar9 < (long)uVar12) {
      do {
        auVar22 = vsqrtss_avx(in_XMM10,ZEXT416((uint)local_48.
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                  .m_data[lVar9]));
        local_68.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[lVar9] = auVar22._0_4_;
        lVar9 = lVar9 + 1;
      } while (uVar12 - lVar9 != 0);
    }
    return;
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
               );
}

Assistant:

void Sqrt::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Sqrt not yet implemented for CUDA");
#else
  auto x = **xs[0];
  (*fx) = x.cwiseSqrt();
#endif
}